

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::Checkbox(char *label,bool *v)

{
  bool bVar1;
  byte *in_RSI;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  ImVec2 label_pos;
  float pad_1;
  ImVec2 pad;
  bool mixed_value;
  ImU32 check_col;
  ImRect check_bb;
  bool pressed;
  bool held;
  bool hovered;
  ImRect total_bb;
  ImVec2 pos;
  float square_sz;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  ImRect *in_stack_fffffffffffffeb0;
  ImDrawFlags flags;
  undefined8 in_stack_fffffffffffffeb8;
  ImVec2 *in_stack_fffffffffffffec0;
  ImRect *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  ImGuiID in_stack_fffffffffffffed4;
  float fVar5;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined8 in_stack_fffffffffffffee8;
  undefined1 hide_text_after_hash;
  float in_stack_fffffffffffffef0;
  ImU32 col;
  ImDrawList *draw_list;
  ImVec2 pos_00;
  undefined8 uVar6;
  float in_stack_ffffffffffffff18;
  ImVec2 in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff2c;
  ImVec2 in_stack_ffffffffffffff30;
  ImVec2 in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  ImGuiNavHighlightFlags in_stack_ffffffffffffff48;
  ImGuiID in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  undefined1 local_8c [33];
  byte local_6b;
  byte local_6a;
  byte local_69;
  undefined1 local_68 [8];
  ImVec2 local_60;
  ImRect local_58;
  ImVec2 local_48;
  float local_40;
  ImVec2 local_3c;
  ImGuiID local_34;
  ImGuiStyle *local_30;
  ImGuiContext *local_28;
  ImGuiWindow *local_20;
  byte *local_18;
  bool local_1;
  
  hide_text_after_hash = (undefined1)((ulong)in_stack_fffffffffffffee8 >> 0x38);
  local_18 = in_RSI;
  local_20 = GetCurrentWindow();
  if ((local_20->SkipItems & 1U) == 0) {
    local_28 = GImGui;
    local_30 = &GImGui->Style;
    uVar6 = 0;
    local_34 = ImGuiWindow::GetID((ImGuiWindow *)
                                  CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                  (char *)in_stack_fffffffffffffec8,
                                  (char *)in_stack_fffffffffffffec0);
    local_3c = CalcTextSize((char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                            (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffec8,0));
    fVar2 = GetFrameHeight();
    local_48 = (local_20->DC).CursorPos;
    if (local_3c.x <= 0.0) {
      fVar3 = 0.0;
    }
    else {
      fVar3 = (local_30->ItemInnerSpacing).x + local_3c.x;
    }
    fVar5 = (local_30->FramePadding).y;
    pos_00 = (ImVec2)local_68;
    local_40 = fVar2;
    ImVec2::ImVec2((ImVec2 *)pos_00,fVar2 + fVar3,fVar5 + fVar5 + local_3c.y);
    local_60 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                           (ImVec2 *)0x518a17);
    ImRect::ImRect(&local_58,&local_48,&local_60);
    ItemSize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    flags = (ImDrawFlags)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
    bVar1 = ItemAdd((ImRect *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                    in_stack_fffffffffffffed4,in_stack_fffffffffffffec8,
                    (ImGuiItemFlags)((ulong)in_stack_fffffffffffffec0 >> 0x20));
    if (bVar1) {
      local_6b = ButtonBehavior((ImRect *)in_stack_ffffffffffffff30,
                                (ImGuiID)in_stack_ffffffffffffff2c,(bool *)in_stack_ffffffffffffff20
                                ,(bool *)CONCAT44(fVar2,in_stack_ffffffffffffff18),
                                (ImGuiButtonFlags)((ulong)uVar6 >> 0x20));
      if ((bool)local_6b) {
        *local_18 = (*local_18 ^ 0xff) & 1;
        MarkItemEdited(local_34);
      }
      draw_list = (ImDrawList *)local_8c;
      ImVec2::ImVec2((ImVec2 *)draw_list,local_40,local_40);
      local_8c._8_8_ =
           ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                       (ImVec2 *)0x518b12);
      ImRect::ImRect((ImRect *)(local_8c + 0x10),&local_48,(ImVec2 *)(local_8c + 8));
      RenderNavHighlight((ImRect *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
      if (((local_6a & 1) == 0) || ((local_69 & 1) == 0)) {
        col = 7;
        if ((local_69 & 1) != 0) {
          col = 8;
        }
      }
      else {
        col = 9;
      }
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                  SUB84(in_stack_fffffffffffffec0,0));
      IVar4.y = fVar2;
      IVar4.x = in_stack_ffffffffffffff18;
      RenderFrame(in_stack_ffffffffffffff20,IVar4,(ImU32)((ulong)uVar6 >> 0x20),
                  SUB81((ulong)uVar6 >> 0x18,0),fVar3);
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                  SUB84(in_stack_fffffffffffffec0,0));
      if (((local_28->LastItemData).InFlags & 0x40U) == 0) {
        if ((*local_18 & 1) != 0) {
          in_stack_ffffffffffffff40 = ImMax<float>(1.0,(float)(int)(local_40 / 6.0));
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff30,in_stack_ffffffffffffff40,
                         in_stack_ffffffffffffff40);
          in_stack_ffffffffffffff38 =
               ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                           (ImVec2 *)0x518db3);
          RenderCheckMark(draw_list,pos_00,col,in_stack_fffffffffffffef0);
        }
      }
      else {
        fVar5 = 3.6;
        fVar3 = 1.0;
        fVar2 = ImMax<float>(1.0,(float)(int)(local_40 / 3.6));
        fVar3 = ImMax<float>(fVar3,(float)(int)(local_40 / fVar5));
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff54,fVar2,fVar3);
        hide_text_after_hash = (undefined1)((ulong)local_20->DrawList >> 0x38);
        ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                    (ImVec2 *)0x518cd2);
        IVar4 = ::operator-((ImVec2 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                            (ImVec2 *)0x518ced);
        in_stack_ffffffffffffff44 = IVar4.x;
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(fVar5,in_stack_fffffffffffffed0),
                   &in_stack_fffffffffffffec8->Min,in_stack_fffffffffffffec0,
                   (ImU32)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                   (float)in_stack_fffffffffffffeb8,flags);
      }
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff28,
                     (float)local_8c._24_4_ + (local_30->ItemInnerSpacing).x,
                     (float)local_8c._20_4_ + (local_30->FramePadding).y);
      if ((local_28->LogEnabled & 1U) != 0) {
        LogRenderedText((ImVec2 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (char *)in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30);
      }
      if (0.0 < local_3c.x) {
        RenderText(pos_00,(char *)draw_list,(char *)CONCAT44(col,in_stack_fffffffffffffef0),
                   (bool)hide_text_after_hash);
      }
      local_1 = (bool)(local_6b & 1);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::Checkbox(const char* label, bool* v)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    const float square_sz = GetFrameHeight();
    const ImVec2 pos = window->DC.CursorPos;
    const ImRect total_bb(pos, pos + ImVec2(square_sz + (label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f), label_size.y + style.FramePadding.y * 2.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id))
    {
        IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags | ImGuiItemStatusFlags_Checkable | (*v ? ImGuiItemStatusFlags_Checked : 0));
        return false;
    }

    bool hovered, held;
    bool pressed = ButtonBehavior(total_bb, id, &hovered, &held);
    if (pressed)
    {
        *v = !(*v);
        MarkItemEdited(id);
    }

    const ImRect check_bb(pos, pos + ImVec2(square_sz, square_sz));
    RenderNavHighlight(total_bb, id);
    RenderFrame(check_bb.Min, check_bb.Max, GetColorU32((held && hovered) ? ImGuiCol_FrameBgActive : hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg), true, style.FrameRounding);
    ImU32 check_col = GetColorU32(ImGuiCol_CheckMark);
    bool mixed_value = (g.LastItemData.InFlags & ImGuiItemFlags_MixedValue) != 0;
    if (mixed_value)
    {
        // Undocumented tristate/mixed/indeterminate checkbox (#2644)
        // This may seem awkwardly designed because the aim is to make ImGuiItemFlags_MixedValue supported by all widgets (not just checkbox)
        ImVec2 pad(ImMax(1.0f, IM_FLOOR(square_sz / 3.6f)), ImMax(1.0f, IM_FLOOR(square_sz / 3.6f)));
        window->DrawList->AddRectFilled(check_bb.Min + pad, check_bb.Max - pad, check_col, style.FrameRounding);
    }
    else if (*v)
    {
        const float pad = ImMax(1.0f, IM_FLOOR(square_sz / 6.0f));
        RenderCheckMark(window->DrawList, check_bb.Min + ImVec2(pad, pad), check_col, square_sz - pad * 2.0f);
    }

    ImVec2 label_pos = ImVec2(check_bb.Max.x + style.ItemInnerSpacing.x, check_bb.Min.y + style.FramePadding.y);
    if (g.LogEnabled)
        LogRenderedText(&label_pos, mixed_value ? "[~]" : *v ? "[x]" : "[ ]");
    if (label_size.x > 0.0f)
        RenderText(label_pos, label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags | ImGuiItemStatusFlags_Checkable | (*v ? ImGuiItemStatusFlags_Checked : 0));
    return pressed;
}